

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O3

void bubble_up(nghttp2_pq *pq,size_t index)

{
  ulong uVar1;
  nghttp2_pq_entry **ppnVar2;
  nghttp2_pq_entry *pnVar3;
  nghttp2_pq_entry *pnVar4;
  int iVar5;
  ulong uVar6;
  
  if (index != 0) {
    do {
      uVar1 = index - 1;
      uVar6 = uVar1 >> 1;
      iVar5 = (*pq->less)(pq->q[index],pq->q[uVar6]);
      if (iVar5 == 0) {
        return;
      }
      ppnVar2 = pq->q;
      pnVar3 = ppnVar2[uVar6];
      pnVar4 = ppnVar2[index];
      ppnVar2[uVar6] = pnVar4;
      pnVar4->index = uVar6;
      pq->q[index] = pnVar3;
      pnVar3->index = index;
      index = uVar6;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

static void bubble_up(nghttp2_pq *pq, size_t index) {
  size_t parent;
  while (index != 0) {
    parent = (index - 1) / 2;
    if (!pq->less(pq->q[index], pq->q[parent])) {
      return;
    }
    swap(pq, parent, index);
    index = parent;
  }
}